

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O2

char * GetPath(char *filename)

{
  ulong uVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  
  sVar3 = strlen(filename);
  uVar4 = sVar3 & 0xffffffff;
  do {
    if ((int)uVar4 < 1) {
      GetPath::curpath[0] = '.';
      GetPath::curpath[1] = '/';
      GetPath::curpath[2] = '\0';
      return GetPath::curpath;
    }
    uVar1 = uVar4 - 1;
    lVar2 = uVar4 - 1;
    uVar4 = uVar1;
  } while (filename[lVar2] != '/');
  strcpy(GetPath::curpath,filename);
  GetPath::curpath[(int)uVar1 + 1U & 0x7fffffff] = '\0';
  return GetPath::curpath;
}

Assistant:

char *GetPath(char *filename) {
	#undef FUNC
	#define FUNC "GetPath"

	static char curpath[PATH_MAX];
	int zelen,idx;

	zelen=strlen(filename);

#ifdef OS_WIN
	#define CURRENT_DIR ".\\"

	TxtReplace(filename,"/","\\",1);
	idx=zelen-1;
	while (idx>=0 && filename[idx]!='\\') idx--;
	if (idx<0) {
		/* pas de chemin */
		strcpy(curpath,".\\");
	} else {
		/* chemin trouve */
		strcpy(curpath,filename);
		curpath[idx+1]=0;
	}
#else
#ifdef __MORPHOS__
	#define CURRENT_DIR ""
#else
	#define CURRENT_DIR "./"
#endif
	idx=zelen-1;
	while (idx>=0 && filename[idx]!='/') idx--;
	if (idx<0) {
		/* pas de chemin */
		strcpy(curpath,CURRENT_DIR);
	} else {
		/* chemin trouve */
		strcpy(curpath,filename);
		curpath[idx+1]=0;
	}
#endif

	return curpath;
}